

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermPartialOrdering.cpp
# Opt level: O3

PoComp __thiscall
Kernel::TermPartialOrdering::getOneExternal(TermPartialOrdering *this,TermList t,size_t idx)

{
  Entry *pEVar1;
  Entry *pEVar2;
  PoComp PVar3;
  int iVar4;
  ulong in_RAX;
  Entry *pEVar5;
  PoComp res;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX & 0xffffffffffffff;
  pEVar1 = (this->_nodes)._afterLast;
  pEVar5 = (this->_nodes)._entries;
  do {
    while( true ) {
      do {
        pEVar2 = pEVar5;
        if (pEVar2 == pEVar1) {
          uStack_38._7_1_ = (PoComp)(uStack_38 >> 0x38);
          return uStack_38._7_1_;
        }
        pEVar5 = pEVar2 + 1;
      } while (((pEVar2->code == 0) || (pEVar2->_value == (MaybeUninit<unsigned_long>)idx)) ||
              (PVar3 = PartialOrdering::get(this->_po,(size_t)pEVar2->_value,idx), PVar3 == UNKNOWN)
              );
      iVar4 = (*this->_ord->_vptr_Ordering[3])(this->_ord,t._content,pEVar2->_key);
      if (iVar4 == 1) break;
      if (iVar4 == 2) {
        if ((PVar3 == NGEQ) || (PVar3 == 6)) {
          PVar3 = NGEQ;
LAB_005cb262:
          checkCompatibility(uStack_38._7_1_,PVar3,(PoComp *)((long)&uStack_38 + 7));
          if (uStack_38._7_1_ == '\x06') {
            return INCOMPARABLE;
          }
        }
        else if (PVar3 - 2 < 2) {
          PVar3 = LESS;
          goto LAB_005cb2bc;
        }
      }
      else if (iVar4 == 3) {
        return PVar3;
      }
    }
    if (PVar3 - 5 < 2) {
      PVar3 = NLEQ;
      goto LAB_005cb262;
    }
  } while (1 < PVar3 - 1);
  PVar3 = GREATER;
LAB_005cb2bc:
  checkCompatibility(uStack_38._7_1_,PVar3,(PoComp *)((long)&uStack_38 + 7));
  return uStack_38._7_1_;
}

Assistant:

PoComp TermPartialOrdering::getOneExternal(TermList t, size_t idx) const
{
  PoComp res = PoComp::UNKNOWN;
  decltype(_nodes)::Iterator it(_nodes);
  while (it.hasNext()) {
    auto& e = it.next();
    if (e.value()==idx) {
      continue;
    }
    auto val = _po->get(e.value(),idx);
    if (val == PoComp::UNKNOWN) {
      continue;
    }
    auto comp = _ord.compare(t,e.key());
    switch (comp) {
      case Ordering::GREATER: {
        switch (val) {
          case PoComp::EQUAL:
          case PoComp::GREATER:
            // t > e ≥ x -> t > x
            ALWAYS(checkCompatibility(res, PoComp::GREATER, res));
            return res;
          case PoComp::NLEQ:
          case PoComp::INCOMPARABLE:
            // t > e ≰ x -> t ≰ x
            ALWAYS(checkCompatibility(res, PoComp::NLEQ, res));
            if (res == PoComp::INCOMPARABLE) {
              return res;
            }
          default:
            break;
        }
        break;
      }
      case Ordering::EQUAL: {
        return val;
      }
      case Ordering::LESS: {
        switch (val) {
          case PoComp::EQUAL:
          case PoComp::LESS:
            // t < e ≤ x -> t < x
            ALWAYS(checkCompatibility(res, PoComp::LESS, res));
            return res;
          case PoComp::NGEQ:
          case PoComp::INCOMPARABLE:
            // t < e ≱ x -> t ≱ x
            ALWAYS(checkCompatibility(res, PoComp::NGEQ, res));
            if (res == PoComp::INCOMPARABLE) {
              return res;
            }
          default:
            break;
        }
        break;
      }
      case Ordering::INCOMPARABLE: {
        break;
      }
    }
  }
  return res;
}